

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_convolve_x_sr_intrabc_c
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < h) {
    iVar1 = 0;
    do {
      if (0 < w) {
        uVar2 = 0;
        do {
          dst[uVar2] = (uint8_t)((uint)src[uVar2] + (uint)src[uVar2 + 1] + 1 >> 1);
          uVar2 = uVar2 + 1;
        } while ((uint)w != uVar2);
      }
      src = src + src_stride;
      dst = dst + dst_stride;
      iVar1 = iVar1 + 1;
    } while (iVar1 != h);
  }
  return;
}

Assistant:

void av1_convolve_x_sr_intrabc_c(const uint8_t *src, int src_stride,
                                 uint8_t *dst, int dst_stride, int w, int h,
                                 const InterpFilterParams *filter_params_x,
                                 const int subpel_x_qn,
                                 ConvolveParams *conv_params) {
  assert(subpel_x_qn == 8);
  assert(filter_params_x->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)conv_params;

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t res = src[x] + src[x + 1];
      dst[x] = clip_pixel(ROUND_POWER_OF_TWO(res, 1));
    }
    src += src_stride;
    dst += dst_stride;
  }
}